

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

stumpless_target * stumpless_set_target_default_app_name(stumpless_target *target,char *app_name)

{
  _Bool _Var1;
  size_t local_28;
  size_t new_length;
  char *app_name_local;
  stumpless_target *target_local;
  
  new_length = (size_t)app_name;
  app_name_local = (char *)target;
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else if (app_name == (char *)0x0) {
    raise_argument_empty("app_name was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    _Var1 = validate_app_name(app_name,&local_28);
    if (_Var1) {
      clear_error();
      lock_target((stumpless_target *)app_name_local);
      memcpy(app_name_local + 0x28,(void *)new_length,local_28);
      *(size_t *)(app_name_local + 0x58) = local_28;
      unlock_target((stumpless_target *)app_name_local);
      target_local = (stumpless_target *)app_name_local;
    }
    else {
      target_local = (stumpless_target *)0x0;
    }
  }
  return target_local;
}

Assistant:

struct stumpless_target *
stumpless_set_target_default_app_name( struct stumpless_target *target,
                                       const char *app_name ) {
  size_t new_length;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( app_name );

  if( unlikely( !validate_app_name( app_name, &new_length ) ) ) {
    return NULL;
  }

  clear_error(  );

  lock_target( target );
  memcpy( target->default_app_name, app_name, new_length );
  target->default_app_name_length = new_length;
  unlock_target( target );

  return target;
}